

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<kj::Promise<unsigned_long>_> * __thiscall
kj::ArrayBuilder<kj::Promise<unsigned_long>_>::operator=
          (ArrayBuilder<kj::Promise<unsigned_long>_> *this,
          ArrayBuilder<kj::Promise<unsigned_long>_> *other)

{
  ArrayBuilder<kj::Promise<unsigned_long>_> *other_local;
  ArrayBuilder<kj::Promise<unsigned_long>_> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (Promise<unsigned_long> *)0x0;
  other->pos = (RemoveConst<kj::Promise<unsigned_long>_> *)0x0;
  other->endPtr = (Promise<unsigned_long> *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }